

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::csharp::MessageGenerator::HasNestedGeneratedTypes
          (MessageGenerator *this)

{
  bool bVar1;
  int iVar2;
  Descriptor *descriptor;
  int local_1c;
  int i;
  MessageGenerator *this_local;
  
  iVar2 = Descriptor::enum_type_count(this->descriptor_);
  if (iVar2 < 1) {
    for (local_1c = 0; iVar2 = Descriptor::nested_type_count(this->descriptor_), local_1c < iVar2;
        local_1c = local_1c + 1) {
      descriptor = Descriptor::nested_type(this->descriptor_,local_1c);
      bVar1 = IsMapEntryMessage(descriptor);
      if (!bVar1) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageGenerator::HasNestedGeneratedTypes()
{
  if (descriptor_->enum_type_count() > 0) {
    return true;
  }
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
      return true;
    }
  }
  return false;
}